

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::PrintUnknownFields
          (Printer *this,UnknownFieldSet *unknown_fields,TextGenerator *generator,
          int recursion_budget)

{
  uint8 **ppuVar1;
  _func_int *p_Var2;
  string *src;
  bool bVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  undefined4 in_register_0000000c;
  undefined8 uVar6;
  pointer pUVar7;
  long lVar8;
  long lVar9;
  Hex hex;
  Hex hex_00;
  undefined1 local_f0 [8];
  CodedInputStream input_stream;
  undefined1 auStack_98 [8];
  UnknownFieldSet embedded_unknown_fields;
  string field_number;
  string local_58;
  Printer *local_38;
  
  input_stream.extension_factory_ =
       (MessageFactory *)CONCAT44(in_register_0000000c,recursion_budget);
  pUVar7 = (unknown_fields->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7) >> 4)) {
    field_number.field_2._12_4_ = recursion_budget + -1;
    lVar8 = 8;
    lVar9 = 0;
    local_38 = this;
    do {
      ppuVar1 = &input_stream.buffer_end_;
      local_f0 = (undefined1  [8])ppuVar1;
      pcVar4 = FastInt32ToBufferLeft(*(int32 *)((long)pUVar7 + lVar8 + -8),(char *)ppuVar1);
      input_stream.buffer_ = (uint8 *)(pcVar4 + -(long)ppuVar1);
      embedded_unknown_fields.fields_.
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&field_number._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &embedded_unknown_fields.fields_.
                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,local_f0,
                 input_stream.buffer_ + (long)local_f0);
      switch(*(undefined4 *)((long)pUVar7 + lVar8 + -4)) {
      case 0:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": ",2);
        if (*(int *)((long)pUVar7 + lVar8 + -4) != 0) {
          __assert_fail("type() == TYPE_VARINT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                        ,0x15a,"uint64 google::protobuf::UnknownField::varint() const");
        }
        ppuVar1 = &input_stream.buffer_end_;
        local_f0 = (undefined1  [8])ppuVar1;
        pcVar4 = FastUInt64ToBufferLeft(*(uint64 *)((long)&pUVar7->number_ + lVar8),(char *)ppuVar1)
        ;
        input_stream.buffer_ = (uint8 *)(pcVar4 + -(long)ppuVar1);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,local_f0,input_stream.buffer_ + (long)local_f0);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 1:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        if (*(int *)((long)pUVar7 + lVar8 + -4) != 1) {
          __assert_fail("type() == TYPE_FIXED32",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                        ,0x15e,"uint32 google::protobuf::UnknownField::fixed32() const");
        }
        hex_00.value = (ulong)*(uint *)((long)&pUVar7->number_ + lVar8);
        hex_00._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_f0,hex_00);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,local_f0,input_stream.buffer_ + (long)local_f0);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 2:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": 0x",4);
        if (*(int *)((long)pUVar7 + lVar8 + -4) != 2) {
          __assert_fail("type() == TYPE_FIXED64",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                        ,0x162,"uint64 google::protobuf::UnknownField::fixed64() const");
        }
        hex._8_8_ = 0x10;
        hex.value = *(uint64 *)((long)&pUVar7->number_ + lVar8);
        strings::AlphaNum::AlphaNum((AlphaNum *)local_f0,hex);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,local_f0,input_stream.buffer_ + (long)local_f0);
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,local_58._M_dataplus._M_p,local_58._M_string_length);
        break;
      case 3:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        if (*(int *)((long)pUVar7 + lVar8 + -4) != 3) {
          __assert_fail("type() == TYPE_LENGTH_DELIMITED",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                        ,0x166,
                        "const std::string &google::protobuf::UnknownField::length_delimited() const"
                       );
        }
        src = *(string **)((long)&pUVar7->number_ + lVar8);
        local_f0 = (undefined1  [8])(src->_M_dataplus)._M_p;
        input_stream.input_._0_4_ = (uint32)src->_M_string_length;
        input_stream.buffer_ = (uint8 *)((long)local_f0 + (long)(int)(uint32)input_stream.input_);
        input_stream.buffer_end_ = (uint8 *)0x0;
        input_stream._20_8_ = 0;
        input_stream.overflow_bytes_._0_2_ = 0;
        input_stream.legitimate_message_end_ = false;
        input_stream.aliasing_enabled_ = false;
        input_stream._38_2_ = 0;
        input_stream.current_limit_ = 0x7fffffff;
        input_stream.recursion_limit_ = 0;
        input_stream._60_4_ = 0;
        input_stream.extension_pool_ = (DescriptorPool *)0x0;
        input_stream.buffer_size_after_limit_ = (int)input_stream.extension_factory_;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        auStack_98 = (undefined1  [8])0x0;
        embedded_unknown_fields.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        input_stream.last_tag_ = (uint32)input_stream.input_;
        input_stream.total_bytes_limit_ = input_stream.buffer_size_after_limit_;
        if (((input_stream.buffer_size_after_limit_ < 1) || (src->_M_string_length == 0)) ||
           (bVar3 = UnknownFieldSet::ParseFromCodedStream
                              ((UnknownFieldSet *)auStack_98,(CodedInputStream *)local_f0), !bVar3))
        {
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])(generator,": \"",3);
          CEscape(&local_58,src);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                    (generator,local_58._M_dataplus._M_p,local_58._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p);
          }
          pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          pcVar4 = "\"\n";
          if (local_38->single_line_mode_ != false) {
            pcVar4 = "\" ";
          }
        }
        else {
          p_Var2 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
          if (local_38->single_line_mode_ == true) {
            (*p_Var2)(generator," { ",3);
          }
          else {
            (*p_Var2)(generator," {\n",3);
            (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
          }
          PrintUnknownFields(local_38,(UnknownFieldSet *)auStack_98,generator,
                             field_number.field_2._12_4_);
          pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
          if (local_38->single_line_mode_ == true) {
            pp_Var5 = pp_Var5 + 5;
            pcVar4 = "} ";
          }
          else {
            (*pp_Var5[3])(generator);
            pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
            pcVar4 = "}\n";
          }
        }
        (**pp_Var5)(generator,pcVar4,2);
        if (auStack_98 !=
            (undefined1  [8])
            embedded_unknown_fields.fields_.
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          UnknownFieldSet::ClearFallback((UnknownFieldSet *)auStack_98);
        }
        if (auStack_98 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_98);
        }
        io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_f0);
        goto switchD_002f8014_default;
      case 4:
        (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5])
                  (generator,
                   embedded_unknown_fields.fields_.
                   super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,field_number._M_dataplus._M_p)
        ;
        p_Var2 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[5];
        if (local_38->single_line_mode_ == true) {
          (*p_Var2)(generator," { ",3);
        }
        else {
          (*p_Var2)(generator," {\n",3);
          (*(generator->super_BaseTextGenerator)._vptr_BaseTextGenerator[2])(generator);
        }
        if (*(int *)((long)pUVar7 + lVar8 + -4) != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/unknown_field_set.h"
                        ,0x16a,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        PrintUnknownFields(local_38,*(UnknownFieldSet **)((long)&pUVar7->number_ + lVar8),generator,
                           field_number.field_2._12_4_);
        pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator;
        if (local_38->single_line_mode_ == true) {
          pp_Var5 = pp_Var5 + 5;
          uVar6 = 2;
          pcVar4 = "} ";
        }
        else {
          (*pp_Var5[3])(generator);
          pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
          uVar6 = 2;
          pcVar4 = "}\n";
        }
        goto LAB_002f8314;
      default:
        goto switchD_002f8014_default;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p);
      }
      pp_Var5 = (generator->super_BaseTextGenerator)._vptr_BaseTextGenerator + 5;
      pcVar4 = "\n";
      if (local_38->single_line_mode_ != false) {
        pcVar4 = " ";
      }
      uVar6 = 1;
LAB_002f8314:
      (**pp_Var5)(generator,pcVar4,uVar6);
switchD_002f8014_default:
      if (embedded_unknown_fields.fields_.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&field_number._M_string_length) {
        operator_delete(embedded_unknown_fields.fields_.
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      lVar9 = lVar9 + 1;
      pUVar7 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (lVar9 < (int)((ulong)((long)(unknown_fields->fields_).
                                         super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar7)
                          >> 4));
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintUnknownFields(
    const UnknownFieldSet& unknown_fields, TextGenerator* generator,
    int recursion_budget) const {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);
    std::string field_number = StrCat(field.number());

    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        generator->PrintString(field_number);
        generator->PrintLiteral(": ");
        generator->PrintString(StrCat(field.varint()));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      case UnknownField::TYPE_FIXED32: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed32(), strings::ZERO_PAD_8)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_FIXED64: {
        generator->PrintString(field_number);
        generator->PrintLiteral(": 0x");
        generator->PrintString(
            StrCat(strings::Hex(field.fixed64(), strings::ZERO_PAD_16)));
        if (single_line_mode_) {
          generator->PrintLiteral(" ");
        } else {
          generator->PrintLiteral("\n");
        }
        break;
      }
      case UnknownField::TYPE_LENGTH_DELIMITED: {
        generator->PrintString(field_number);
        const std::string& value = field.length_delimited();
        // We create a CodedInputStream so that we can adhere to our recursion
        // budget when we attempt to parse the data. UnknownFieldSet parsing is
        // recursive because of groups.
        io::CodedInputStream input_stream(
            reinterpret_cast<const uint8*>(value.data()), value.size());
        input_stream.SetRecursionLimit(recursion_budget);
        UnknownFieldSet embedded_unknown_fields;
        if (!value.empty() && recursion_budget > 0 &&
            embedded_unknown_fields.ParseFromCodedStream(&input_stream)) {
          // This field is parseable as a Message.
          // So it is probably an embedded message.
          if (single_line_mode_) {
            generator->PrintLiteral(" { ");
          } else {
            generator->PrintLiteral(" {\n");
            generator->Indent();
          }
          PrintUnknownFields(embedded_unknown_fields, generator,
                             recursion_budget - 1);
          if (single_line_mode_) {
            generator->PrintLiteral("} ");
          } else {
            generator->Outdent();
            generator->PrintLiteral("}\n");
          }
        } else {
          // This field is not parseable as a Message (or we ran out of
          // recursion budget). So it is probably just a plain string.
          generator->PrintLiteral(": \"");
          generator->PrintString(CEscape(value));
          if (single_line_mode_) {
            generator->PrintLiteral("\" ");
          } else {
            generator->PrintLiteral("\"\n");
          }
        }
        break;
      }
      case UnknownField::TYPE_GROUP:
        generator->PrintString(field_number);
        if (single_line_mode_) {
          generator->PrintLiteral(" { ");
        } else {
          generator->PrintLiteral(" {\n");
          generator->Indent();
        }
        // For groups, we recurse without checking the budget. This is OK,
        // because if the groups were too deeply nested then we would have
        // already rejected the message when we originally parsed it.
        PrintUnknownFields(field.group(), generator, recursion_budget - 1);
        if (single_line_mode_) {
          generator->PrintLiteral("} ");
        } else {
          generator->Outdent();
          generator->PrintLiteral("}\n");
        }
        break;
    }
  }
}